

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall SQSharedState::Init(SQSharedState *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQUnsignedInteger SVar4;
  SQStringTable *pSVar5;
  SQString **__s;
  SQObjectPtrVec *pSVar6;
  SQTable *pSVar7;
  SQObjectPtr *pSVar8;
  SQString *pSVar9;
  SQUnsignedInteger SVar10;
  SQObjectPtr local_28;
  
  this->_gc_chain = (SQCollectable_conflict *)0x0;
  this->_scratchpad = (SQChar *)0x0;
  this->_scratchpadsize = 0;
  pSVar5 = (SQStringTable *)sq_vm_malloc(0x20);
  this->_stringtable = pSVar5;
  pSVar5->_sharedstate = this;
  pSVar5->_numofslots = 4;
  __s = (SQString **)sq_vm_malloc(0x20);
  pSVar5->_strings = __s;
  memset(__s,0,pSVar5->_numofslots << 3);
  pSVar5->_slotused = 0;
  pSVar6 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_metamethods = pSVar6;
  pSVar6->_vals = (SQObjectPtr *)0x0;
  pSVar6->_size = 0;
  pSVar6->_allocated = 0;
  pSVar6 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_systemstrings = pSVar6;
  pSVar6->_vals = (SQObjectPtr *)0x0;
  pSVar6->_size = 0;
  pSVar6->_allocated = 0;
  pSVar6 = (SQObjectPtrVec *)sq_vm_malloc(0x18);
  this->_types = pSVar6;
  pSVar6->_vals = (SQObjectPtr *)0x0;
  pSVar6->_size = 0;
  pSVar6->_allocated = 0;
  pSVar7 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar7,this,0x11);
  (pSVar7->super_SQDelegable)._delegate = (SQTable *)0x0;
  pSVar3 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  SVar2 = (this->_metamethodsmap).super_SQObject._type;
  (this->_metamethodsmap).super_SQObject._type = OT_TABLE;
  (this->_metamethodsmap).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"null",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"table",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"array",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"closure",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"string",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"userdata",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"integer",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"float",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"userpointer",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"function",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"generator",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"thread",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"class",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"instance",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_systemstrings;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"bool",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_add",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_sub",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_mul",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_div",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_unm",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_modulo",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_set",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_get",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_typeof",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_nexti",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_cmp",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_call",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_cloned",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_newslot",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_delslot",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_tostring",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_newmember",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pString = SQString::Create(this,"_inherited",-1);
  local_28.super_SQObject._type = OT_STRING;
  pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (pSVar6->_allocated <= pSVar6->_size) {
    SVar4 = pSVar6->_size * 2;
    SVar10 = 4;
    if (SVar4 != 0) {
      SVar10 = SVar4;
    }
    pSVar8 = (SQObjectPtr *)sq_vm_realloc(pSVar6->_vals,pSVar6->_allocated << 4,SVar10 << 4);
    pSVar6->_vals = pSVar8;
    pSVar6->_allocated = SVar10;
  }
  pSVar8 = pSVar6->_vals;
  SVar4 = pSVar6->_size;
  pSVar6->_size = SVar4 + 1;
  pSVar8[SVar4].super_SQObject._type = local_28.super_SQObject._type;
  pSVar8[SVar4].super_SQObject._unVal.pString = (SQString *)local_28.super_SQObject._unVal;
  if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((pSVar8[SVar4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar6 = this->_metamethods;
  local_28.super_SQObject._unVal.pTable = (SQTable *)(pSVar6->_size - 1);
  local_28.super_SQObject._type = OT_INTEGER;
  SQTable::NewSlot((this->_metamethodsmap).super_SQObject._unVal.pTable,
                   pSVar6->_vals + (pSVar6->_size - 1),&local_28);
  SQObjectPtr::~SQObjectPtr(&local_28);
  pSVar9 = SQString::Create(this,"constructor",-1);
  pSVar3 = (this->_constructoridx).super_SQObject._unVal.pTable;
  SVar2 = (this->_constructoridx).super_SQObject._type;
  (this->_constructoridx).super_SQObject._type = OT_STRING;
  (this->_constructoridx).super_SQObject._unVal.pString = pSVar9;
  pSVar1 = &(pSVar9->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar7,this,0);
  (pSVar7->super_SQDelegable)._delegate = (SQTable *)0x0;
  pSVar3 = (this->_registry).super_SQObject._unVal.pTable;
  SVar2 = (this->_registry).super_SQObject._type;
  (this->_registry).super_SQObject._type = OT_TABLE;
  (this->_registry).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar7,this,0);
  (pSVar7->super_SQDelegable)._delegate = (SQTable *)0x0;
  pSVar3 = (this->_consts).super_SQObject._unVal.pTable;
  SVar2 = (this->_consts).super_SQObject._type;
  (this->_consts).super_SQObject._type = OT_TABLE;
  (this->_consts).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_table_default_delegate_funcz);
  pSVar3 = (this->_table_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_table_default_delegate).super_SQObject._type;
  (this->_table_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_table_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_array_default_delegate_funcz);
  pSVar3 = (this->_array_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_array_default_delegate).super_SQObject._type;
  (this->_array_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_array_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_string_default_delegate_funcz);
  pSVar3 = (this->_string_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_string_default_delegate).super_SQObject._type;
  (this->_string_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_string_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_number_default_delegate_funcz);
  pSVar3 = (this->_number_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_number_default_delegate).super_SQObject._type;
  (this->_number_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_number_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
  pSVar3 = (this->_closure_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_closure_default_delegate).super_SQObject._type;
  (this->_closure_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_closure_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
  pSVar3 = (this->_generator_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_generator_default_delegate).super_SQObject._type;
  (this->_generator_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_generator_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
  pSVar3 = (this->_thread_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_thread_default_delegate).super_SQObject._type;
  (this->_thread_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_thread_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_class_default_delegate_funcz);
  pSVar3 = (this->_class_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_class_default_delegate).super_SQObject._type;
  (this->_class_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_class_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
  pSVar3 = (this->_instance_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_instance_default_delegate).super_SQObject._type;
  (this->_instance_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_instance_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar7 = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
  pSVar3 = (this->_weakref_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_weakref_default_delegate).super_SQObject._type;
  (this->_weakref_default_delegate).super_SQObject._type = OT_TABLE;
  (this->_weakref_default_delegate).super_SQObject._unVal.pTable = pSVar7;
  pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return;
}

Assistant:

void SQSharedState::Init()
{
    _scratchpad=NULL;
    _scratchpadsize=0;
#ifndef NO_GARBAGE_COLLECTOR
    _gc_chain=NULL;
#endif
    _stringtable = (SQStringTable*)SQ_MALLOC(sizeof(SQStringTable));
    new (_stringtable) SQStringTable(this);
    sq_new(_metamethods,SQObjectPtrVec);
    sq_new(_systemstrings,SQObjectPtrVec);
    sq_new(_types,SQObjectPtrVec);
    _metamethodsmap = SQTable::Create(this,MT_LAST-1);
    //adding type strings to avoid memory trashing
    //types names
    newsysstring(_SC("null"));
    newsysstring(_SC("table"));
    newsysstring(_SC("array"));
    newsysstring(_SC("closure"));
    newsysstring(_SC("string"));
    newsysstring(_SC("userdata"));
    newsysstring(_SC("integer"));
    newsysstring(_SC("float"));
    newsysstring(_SC("userpointer"));
    newsysstring(_SC("function"));
    newsysstring(_SC("generator"));
    newsysstring(_SC("thread"));
    newsysstring(_SC("class"));
    newsysstring(_SC("instance"));
    newsysstring(_SC("bool"));
    //meta methods
    newmetamethod(MM_ADD);
    newmetamethod(MM_SUB);
    newmetamethod(MM_MUL);
    newmetamethod(MM_DIV);
    newmetamethod(MM_UNM);
    newmetamethod(MM_MODULO);
    newmetamethod(MM_SET);
    newmetamethod(MM_GET);
    newmetamethod(MM_TYPEOF);
    newmetamethod(MM_NEXTI);
    newmetamethod(MM_CMP);
    newmetamethod(MM_CALL);
    newmetamethod(MM_CLONED);
    newmetamethod(MM_NEWSLOT);
    newmetamethod(MM_DELSLOT);
    newmetamethod(MM_TOSTRING);
    newmetamethod(MM_NEWMEMBER);
    newmetamethod(MM_INHERITED);

    _constructoridx = SQString::Create(this,_SC("constructor"));
    _registry = SQTable::Create(this,0);
    _consts = SQTable::Create(this,0);
    _table_default_delegate = CreateDefaultDelegate(this,_table_default_delegate_funcz);
    _array_default_delegate = CreateDefaultDelegate(this,_array_default_delegate_funcz);
    _string_default_delegate = CreateDefaultDelegate(this,_string_default_delegate_funcz);
    _number_default_delegate = CreateDefaultDelegate(this,_number_default_delegate_funcz);
    _closure_default_delegate = CreateDefaultDelegate(this,_closure_default_delegate_funcz);
    _generator_default_delegate = CreateDefaultDelegate(this,_generator_default_delegate_funcz);
    _thread_default_delegate = CreateDefaultDelegate(this,_thread_default_delegate_funcz);
    _class_default_delegate = CreateDefaultDelegate(this,_class_default_delegate_funcz);
    _instance_default_delegate = CreateDefaultDelegate(this,_instance_default_delegate_funcz);
    _weakref_default_delegate = CreateDefaultDelegate(this,_weakref_default_delegate_funcz);
}